

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadCurves(XMLLoader *this,Ref<embree::XML> *xml,RTCGeometryType type)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *pvVar1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *pvVar2;
  string *psVar3;
  pointer puVar4;
  avector<Vec3ff> *paVar5;
  XML *pXVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  HairSetNode *pHVar11;
  undefined8 in_RCX;
  long *siglen;
  undefined4 in_register_00000014;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  uchar *in_R8;
  size_t in_R9;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *vertices;
  ulong uVar12;
  avector<Vec3ff> *positions;
  string tessellation_rate;
  Ref<embree::XML> animation_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> curveid;
  Ref<embree::SceneGraph::MaterialNode> material;
  string local_d8;
  undefined1 local_b8 [32];
  undefined8 *local_98;
  HairSetNode *local_90;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  _Alloc_hider local_38;
  
  local_98 = (undefined8 *)CONCAT44(in_register_00000014,type);
  psVar3 = (string *)*local_98;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_88._24_8_ = in_RCX;
  local_38._M_p = (pointer)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"material","");
  XML::child((XML *)local_b8,psVar3);
  loadMaterial((XMLLoader *)(local_48 + 8),xml);
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  pHVar11 = (HairSetNode *)operator_new(0x118);
  local_48._0_8_ = local_48._8_8_;
  local_90 = pHVar11;
  if ((_Base_ptr)local_48._8_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_48._8_8_ + 0x10))();
  }
  SceneGraph::HairSetNode::HairSetNode
            (pHVar11,(RTCGeometryType)local_88._24_8_,
             (Ref<embree::SceneGraph::MaterialNode> *)local_48,(BBox1f)0x3f80000000000000,0);
  (*(pHVar11->super_Node).super_RefCount._vptr_RefCount[2])(pHVar11);
  if ((_Base_ptr)local_48._0_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 0x18))();
  }
  psVar3 = (string *)*local_98;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"animated_positions","");
  XML::childOpt((XML *)local_88,psVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((long *)local_88._0_8_ == (long *)0x0) {
    psVar3 = (string *)*local_98;
    local_b8._0_8_ = (XML *)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"positions","");
    pHVar11 = local_90;
    XML::childOpt((XML *)local_68,psVar3);
    loadVec3ffArray((avector<Vec3ff> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_68);
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)&pHVar11->positions,
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               &local_d8);
    alignedFree((void *)local_d8.field_2._8_8_);
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    local_d8.field_2._8_8_ = (void *)0x0;
    if ((XML *)local_68._0_8_ != (XML *)0x0) {
      (*((RefCount *)local_68._0_8_)->_vptr_RefCount[3])();
    }
    if ((XML *)local_b8._0_8_ != (XML *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    pXVar6 = (XML *)*local_98;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"positions2","");
    bVar8 = XML::hasChild(pXVar6,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (bVar8) {
      psVar3 = (string *)*local_98;
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"positions2","");
      XML::childOpt((XML *)local_68,psVar3);
      loadVec3ffArray((avector<Vec3ff> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_68);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&pHVar11->positions,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_d8);
      alignedFree((void *)local_d8.field_2._8_8_);
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_8_ = (void *)0x0;
      if ((XML *)local_68._0_8_ != (XML *)0x0) {
        (*((RefCount *)local_68._0_8_)->_vptr_RefCount[3])();
      }
      if ((XML *)local_b8._0_8_ != (XML *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
  }
  else if (*(long *)(local_88._0_8_ + 0x88) != *(long *)(local_88._0_8_ + 0x80)) {
    pvVar1 = &local_90->positions;
    uVar12 = 0;
    do {
      XML::child((XML *)local_b8,local_88._0_8_);
      loadVec3ffArray((avector<Vec3ff> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_b8);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)pvVar1,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_d8);
      alignedFree((void *)local_d8.field_2._8_8_);
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_8_ = (void *)0x0;
      if ((XML *)local_b8._0_8_ != (XML *)0x0) {
        (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(*(long *)(local_88._0_8_ + 0x88) - *(long *)(local_88._0_8_ + 0x80) >>
                             3));
  }
  if ((long *)local_88._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_88._0_8_ + 0x18))();
  }
  psVar3 = (string *)*local_98;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"animated_normals","");
  XML::childOpt((XML *)local_b8,psVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((XML *)local_b8._0_8_ == (XML *)0x0) {
    psVar3 = (string *)*local_98;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"normals","");
    pHVar11 = local_90;
    XML::childOpt((XML *)local_88,psVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((long *)local_88._0_8_ != (long *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_88);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&pHVar11->normals,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_d8);
      alignedFree((void *)local_d8.field_2._8_8_);
    }
    if ((long *)local_88._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 0x18))();
    }
  }
  else if (*(pointer *)(local_b8._0_8_ + 0x88) !=
           (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_b8._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_start) {
    pvVar2 = &local_90->normals;
    uVar12 = 0;
    do {
      XML::child((XML *)local_88,local_b8._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_88);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)pvVar2,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_d8);
      alignedFree((void *)local_d8.field_2._8_8_);
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_8_ = (void *)0x0;
      if ((long *)local_88._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_88._0_8_ + 0x18))();
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)*(pointer *)(local_b8._0_8_ + 0x88) -
                              (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                       *)(local_b8._0_8_ + 0x80))->
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if (local_88._24_4_ - 0x28 < 3) {
    psVar3 = (string *)*local_98;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"animated_tangents","");
    XML::childOpt((XML *)local_b8,psVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((XML *)local_b8._0_8_ == (XML *)0x0) {
      psVar3 = (string *)*local_98;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"tangents","");
      pHVar11 = local_90;
      XML::childOpt((XML *)local_88,psVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((long *)local_88._0_8_ != (long *)0x0) {
        loadVec3ffArray((avector<Vec3ff> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_88);
        std::
        vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                    *)&pHVar11->tangents,
                   (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                   &local_d8);
        alignedFree((void *)local_d8.field_2._8_8_);
      }
      if ((long *)local_88._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_88._0_8_ + 0x18))();
      }
    }
    else if (*(pointer *)(local_b8._0_8_ + 0x88) !=
             (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
              (local_b8._0_8_ + 0x80))->
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             )._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = &local_90->tangents;
      uVar12 = 0;
      do {
        XML::child((XML *)local_88,local_b8._0_8_);
        loadVec3ffArray((avector<Vec3ff> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_88);
        std::
        vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                    *)pvVar1,
                   (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                   &local_d8);
        alignedFree((void *)local_d8.field_2._8_8_);
        local_d8._M_string_length = 0;
        local_d8.field_2._M_allocated_capacity = 0;
        local_d8.field_2._8_8_ = (void *)0x0;
        if ((long *)local_88._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_88._0_8_ + 0x18))();
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)*(pointer *)(local_b8._0_8_ + 0x88) -
                                (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                         *)(local_b8._0_8_ + 0x80))->
                                      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((XML *)local_b8._0_8_ != (XML *)0x0) {
      (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
    }
    if (local_88._24_4_ == 0x2a) {
      psVar3 = (string *)*local_98;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"animated_normal_derivatives","");
      XML::childOpt((XML *)local_b8,psVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((XML *)local_b8._0_8_ == (XML *)0x0) {
        psVar3 = (string *)*local_98;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"normal_derivatives","")
        ;
        pHVar11 = local_90;
        XML::childOpt((XML *)local_88,psVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if ((long *)local_88._0_8_ != (long *)0x0) {
          loadVec3faArray((avector<Vec3fa> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_88
                         );
          std::
          vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
          ::
          emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                    ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      *)&pHVar11->dnormals,
                     (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     &local_d8);
          alignedFree((void *)local_d8.field_2._8_8_);
        }
        if ((long *)local_88._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_88._0_8_ + 0x18))();
        }
      }
      else if (*(pointer *)(local_b8._0_8_ + 0x88) !=
               (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                (local_b8._0_8_ + 0x80))->
               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
               )._M_impl.super__Vector_impl_data._M_start) {
        pvVar2 = &local_90->dnormals;
        uVar12 = 0;
        do {
          XML::child((XML *)local_88,local_b8._0_8_);
          loadVec3faArray((avector<Vec3fa> *)&local_d8,(XMLLoader *)xml,(Ref<embree::XML> *)local_88
                         );
          std::
          vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
          ::
          emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                    ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      *)pvVar2,
                     (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     &local_d8);
          alignedFree((void *)local_d8.field_2._8_8_);
          local_d8._M_string_length = 0;
          local_d8.field_2._M_allocated_capacity = 0;
          local_d8.field_2._8_8_ = (void *)0x0;
          if ((long *)local_88._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_88._0_8_ + 0x18))();
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)*(pointer *)(local_b8._0_8_ + 0x88) -
                                  (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                           *)(local_b8._0_8_ + 0x80))->
                                        super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if ((XML *)local_b8._0_8_ != (XML *)0x0) {
        (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
      }
    }
  }
  pHVar11 = local_90;
  psVar3 = (string *)*local_98;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"indices","");
  XML::childOpt((XML *)local_b8,psVar3);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,(XMLLoader *)xml,
                (Ref<embree::XML> *)local_b8);
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  psVar3 = (string *)*local_98;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"curveid","");
  XML::childOpt((XML *)local_b8,psVar3);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,(XMLLoader *)xml,
                (Ref<embree::XML> *)local_b8);
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = local_d8._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
             (long)(local_88._8_8_ - local_88._0_8_) >> 2,(value_type_conflict2 *)&local_d8);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(&pHVar11->hairs,(long)(local_88._8_8_ - local_88._0_8_) >> 2);
  if (local_88._8_8_ != local_88._0_8_) {
    uVar12 = 0;
    do {
      *(ulong *)((long)(pHVar11->hairs).
                       super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar12 * 8) =
           CONCAT44(*(undefined4 *)
                     ((long)&((RefCount *)local_68._0_8_)->_vptr_RefCount + uVar12 * 4),
                    *(undefined4 *)(local_88._0_8_ + uVar12 * 4));
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(local_88._8_8_ - local_88._0_8_) >> 2));
  }
  psVar3 = (string *)*local_98;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  siglen = (long *)local_88._0_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"flags","");
  XML::childOpt((XML *)(local_68 + 0x18),psVar3);
  loadUCharArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,(XMLLoader *)xml,
                 (Ref<embree::XML> *)(local_68 + 0x18));
  puVar4 = (pHVar11->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pHVar11->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
  (pHVar11->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
  (pHVar11->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._16_8_;
  local_b8._0_8_ = (XML *)0x0;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = (element_type *)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((_Base_ptr)local_68._24_8_ != (_Base_ptr)0x0) {
    (*(*(_func_int ***)local_68._24_8_)[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_88._24_4_ - 0x20 < 3) {
    positions = (pHVar11->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    paVar5 = (pHVar11->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (positions != paVar5) {
      do {
        fix_bspline_end_points
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,positions);
        positions = positions + 1;
      } while (positions != paVar5);
    }
  }
  pXVar6 = (XML *)*local_98;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"tessellation_rate","");
  XML::parm(&local_d8,pXVar6,(string *)local_b8);
  _Var7._M_p = local_38._M_p;
  if ((XML *)local_b8._0_8_ != (XML *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
  ctx = (EVP_PKEY_CTX *)0x24fb7e;
  iVar9 = std::__cxx11::string::compare((char *)&local_d8);
  sig = extraout_RDX;
  if (iVar9 != 0) {
    uVar10 = atoi(local_d8._M_dataplus._M_p);
    pHVar11->tessellation_rate = uVar10;
    sig = extraout_RDX_00;
  }
  SceneGraph::HairSetNode::verify(pHVar11,ctx,sig,(size_t)siglen,in_R8,in_R9);
  *(HairSetNode **)_Var7._M_p = pHVar11;
  (*(pHVar11->super_Node).super_RefCount._vptr_RefCount[2])(pHVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((XML *)local_68._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  if ((long *)local_88._0_8_ != (long *)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  (*(pHVar11->super_Node).super_RefCount._vptr_RefCount[3])(pHVar11);
  if ((_Base_ptr)local_48._8_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_48._8_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)_Var7._M_p;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadCurves(const Ref<XML>& xml, RTCGeometryType type)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
      }
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) {
        mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions2")));
      }
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
      }
    } else if (Ref<XML> normals = xml->childOpt("normals")) {
      mesh->normals.push_back(loadVec3faArray(normals));
    }

    if (type == RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE ||
        type == RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE ||
        type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE)
    {
      if (Ref<XML> animation = xml->childOpt("animated_tangents")) {
        for (size_t i=0; i<animation->size(); i++) {
          mesh->tangents.push_back(loadVec3ffArray(animation->child(i)));
        }
      } else if (Ref<XML> tangents = xml->childOpt("tangents")) {
        mesh->tangents.push_back(loadVec3ffArray(tangents));
      }
    }

    if (type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE)
    {
      if (Ref<XML> animation = xml->childOpt("animated_normal_derivatives")) {
        for (size_t i=0; i<animation->size(); i++) {
          mesh->dnormals.push_back(loadVec3faArray(animation->child(i)));
        }
      } else if (Ref<XML> dnormals = xml->childOpt("normal_derivatives")) {
        mesh->dnormals.push_back(loadVec3faArray(dnormals));
      }
    }

    std::vector<unsigned> indices = loadUIntArray(xml->childOpt("indices"));
    std::vector<unsigned> curveid = loadUIntArray(xml->childOpt("curveid"));
    curveid.resize(indices.size(),0);
    mesh->hairs.resize(indices.size());
    for (size_t i=0; i<indices.size(); i++) {
      mesh->hairs[i] = SceneGraph::HairSetNode::Hair(indices[i],
                                                     curveid[i]);
    }

    mesh->flags = loadUCharArray(xml->childOpt("flags"));
    
    if (type == RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE ||
        type == RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE ||
        type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE)
    {
      for (auto& vertices : mesh->positions)
        fix_bspline_end_points(indices,vertices);
    }

    std::string tessellation_rate = xml->parm("tessellation_rate");
    if (tessellation_rate != "")
      mesh->tessellation_rate = atoi(tessellation_rate.c_str());

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }